

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.h
# Opt level: O0

void __thiscall google::protobuf::TextFormat::Finder::Finder(Finder *this)

{
  Finder *this_local;
  
  this->_vptr_Finder = (_func_int **)&PTR__Finder_00412680;
  return;
}

Assistant:

class LIBPROTOBUF_EXPORT Finder {
   public:
    virtual ~Finder();

    // Try to find an extension of *message by fully-qualified field
    // name.  Returns NULL if no extension is known for this name or number.
    virtual const FieldDescriptor* FindExtension(
        Message* message,
        const string& name) const = 0;
  }